

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O1

int Abc_NtkReadLogFile(char *pFileName,Abc_Cex_t **ppCex,int *pnFrames)

{
  int nRegs;
  int iVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar4;
  Abc_Cex_t *pAVar5;
  int nFrames;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  int iFrameCex;
  int iVar9;
  char Buffer [1000];
  int local_430;
  int local_42c;
  undefined4 local_418;
  undefined4 uStack_414;
  char local_410;
  char local_40f [991];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for reading \"%s\".\n",pFileName);
    return -1;
  }
  fgets((char *)&local_418,1000,__stream);
  if (local_410 == 'T' && CONCAT44(uStack_414,local_418) == 0x41534e555f6c6e73) {
    local_42c = atoi(local_40f);
    iVar9 = 1;
LAB_002d5ed7:
    local_430 = -1;
    iVar1 = -1;
  }
  else {
    if (CONCAT31((undefined3)uStack_414,local_418._3_1_) != 0x5441535f || local_418 != 0x5f6c6e73) {
      if (CONCAT31((undefined3)uStack_414,local_418._3_1_) == 0x4b4e555f && local_418 == 0x5f6c6e73)
      {
        local_42c = atoi((char *)((long)&uStack_414 + 3));
      }
      else {
        puts("Unrecognized status.");
        local_42c = -1;
      }
      iVar9 = -1;
      goto LAB_002d5ed7;
    }
    pcVar8 = strtok((char *)((long)&uStack_414 + 3)," \t\n");
    local_42c = atoi(pcVar8);
    iVar9 = 0;
    strtok((char *)0x0," \t\n");
    pcVar8 = strtok((char *)0x0," \t\n");
    iVar1 = -1;
    if (pcVar8 == (char *)0x0) {
      local_430 = -1;
    }
    else {
      local_430 = atoi(pcVar8);
      pcVar8 = strtok((char *)0x0," \t\n");
      iVar9 = 0;
      if (pcVar8 != (char *)0x0) {
        iVar1 = atoi(pcVar8);
        iVar9 = 0;
      }
    }
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  while ((uVar2 = fgetc(__stream), uVar2 != 0xffffffff && (uVar2 != 10))) {
    if ((uVar2 & 0xfffffffe) == 0x30) {
      Vec_IntPush(p,uVar2 - 0x30);
    }
  }
  nRegs = p->nSize;
  while (uVar2 = fgetc(__stream), uVar2 != 0xffffffff) {
    if ((uVar2 & 0xfffffffe) == 0x30) {
      Vec_IntPush(p,uVar2 - 0x30);
    }
  }
  fclose(__stream);
  uVar2 = p->nSize;
  if (iVar1 == -1) {
    iVar1 = local_42c;
  }
  if (uVar2 == 0) {
    pAVar5 = Abc_CexAlloc(0,0,iVar1 + 1);
    pAVar5->iFrame = iVar1;
    pAVar5->iPo = local_430;
    if (ppCex != (Abc_Cex_t **)0x0) {
      *ppCex = pAVar5;
    }
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
LAB_002d5fd0:
    if (pnFrames != (int *)0x0) {
      *pnFrames = local_42c;
      return iVar9;
    }
    return iVar9;
  }
  if (nRegs < 0) {
    pcVar8 = "Cannot read register number.";
  }
  else {
    iVar3 = uVar2 - nRegs;
    if (iVar3 == 0) {
      pcVar8 = "Cannot read counter example.";
    }
    else {
      nFrames = iVar1 + 1;
      if (iVar3 % nFrames == 0) {
        pAVar5 = Abc_CexAlloc(nRegs,iVar3 / nFrames,nFrames);
        pAVar5->iPo = local_430;
        pAVar5->iFrame = iVar1;
        if (uVar2 != pAVar5->nBits) {
          __assert_fail("Vec_IntSize(vNums) == pCex->nBits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLog.c"
                        ,0xdb,"int Abc_NtkReadLogFile(char *, Abc_Cex_t **, int *)");
        }
        if (0 < pAVar5->nBits) {
          uVar6 = 0;
          uVar7 = (ulong)uVar2;
          if ((int)uVar2 < 1) {
            uVar7 = uVar6;
          }
          do {
            if (uVar7 == uVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (p->pArray[uVar6] != 0) {
              (&pAVar5[1].iPo)[uVar6 >> 5 & 0x7ffffff] =
                   (&pAVar5[1].iPo)[uVar6 >> 5 & 0x7ffffff] | 1 << ((byte)uVar6 & 0x1f);
            }
            uVar6 = uVar6 + 1;
          } while ((long)uVar6 < (long)pAVar5->nBits);
        }
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
        if (ppCex == (Abc_Cex_t **)0x0) {
          free(pAVar5);
        }
        else {
          *ppCex = pAVar5;
        }
        goto LAB_002d5fd0;
      }
      pcVar8 = "Incorrect number of bits.";
    }
  }
  puts(pcVar8);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return -1;
}

Assistant:

int Abc_NtkReadLogFile( char * pFileName, Abc_Cex_t ** ppCex, int * pnFrames )
{
    FILE * pFile;
    Abc_Cex_t * pCex;
    Vec_Int_t * vNums;
    char Buffer[1000], * pToken, * RetValue;
    int c, nRegs = -1, nFrames = -1, iPo = -1, Status = -1, nFrames2 = -1;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for reading \"%s\".\n" , pFileName );
        return -1;
    }
    RetValue = fgets( Buffer, 1000, pFile );
    if ( !strncmp( Buffer, "snl_UNSAT", strlen("snl_UNSAT") ) )
    {
        Status = 1;
        nFrames = atoi( Buffer + strlen("snl_UNSAT") ); 
    }
    else if ( !strncmp( Buffer, "snl_SAT", strlen("snl_SAT") ) )
    {
        Status = 0;
//        nFrames = atoi( Buffer + strlen("snl_SAT") ); 
        pToken  = strtok( Buffer + strlen("snl_SAT"), " \t\n" );
        nFrames = atoi( pToken ); 
        pToken  = strtok( NULL, " \t\n" );
        pToken  = strtok( NULL, " \t\n" );
        if ( pToken != NULL )
        {
            iPo     = atoi( pToken ); 
            pToken  = strtok( NULL, " \t\n" );
            if ( pToken )
                nFrames2 = atoi( pToken ); 
        }
//        else
//            printf( "Warning! The current status is SAT but the current CEX is not given.\n"  );
    }
    else if ( !strncmp( Buffer, "snl_UNK", strlen("snl_UNK") ) )
    {
        Status = -1;
        nFrames = atoi( Buffer + strlen("snl_UNK") ); 
    }
    else
    {
        printf( "Unrecognized status.\n" );
    }
    // found regs till the new line
    vNums = Vec_IntAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' )
            break;
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    nRegs = Vec_IntSize(vNums);
    // skip till the new line
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    fclose( pFile );
    if ( Vec_IntSize(vNums) )
    {
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        if ( nRegs < 0 )
        {
            printf( "Cannot read register number.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( Vec_IntSize(vNums)-nRegs == 0 )
        {
            printf( "Cannot read counter example.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( (Vec_IntSize(vNums)-nRegs) % (iFrameCex + 1) != 0 )
        {
            printf( "Incorrect number of bits.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        pCex = Abc_CexAlloc( nRegs, (Vec_IntSize(vNums)-nRegs)/(iFrameCex + 1), iFrameCex + 1 );
        pCex->iPo    = iPo;
        pCex->iFrame = iFrameCex;
        assert( Vec_IntSize(vNums) == pCex->nBits );
        for ( c = 0; c < pCex->nBits; c++ )
            if ( Vec_IntEntry(vNums, c) )
                Abc_InfoSetBit( pCex->pData, c );
        Vec_IntFree( vNums );
        if ( ppCex )
            *ppCex = pCex;
        else
            ABC_FREE( pCex );
    }
    else
    {                                                         
        // corner case of seq circuit with no PIs             
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        pCex = Abc_CexAlloc( 0, 0, iFrameCex + 1 );           
        pCex->iFrame = iFrameCex;                             
        pCex->iPo    = iPo;                                   
        if ( ppCex )                                          
            *ppCex = pCex;                                    
        Vec_IntFree( vNums );                                 
    }                                                         
    if ( pnFrames )
        *pnFrames = nFrames;
    return Status;
}